

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O0

void __thiscall
StaticSynapse::StaticSynapse(StaticSynapse *this,Population *n_from,Population *n_to)

{
  Population *n_to_00;
  Synapse *in_RDI;
  Population *in_stack_ffffffffffffffd8;
  StaticSynapse *in_stack_ffffffffffffffe0;
  
  Synapse::Synapse(in_RDI);
  in_RDI->_vptr_Synapse = (_func_int **)&PTR_update_0017fd18;
  n_to_00 = (Population *)operator_new(8);
  StaticSynapse_param::StaticSynapse_param((StaticSynapse_param *)n_to_00);
  in_RDI[1]._vptr_Synapse = (_func_int **)n_to_00;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1636d4);
  initialize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,n_to_00);
  return;
}

Assistant:

StaticSynapse::StaticSynapse(Population* n_from, Population* n_to) : 
    param(new StaticSynapse_param)
{
    initialize(n_from, n_to);
}